

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator+=(SSVectorBase<double> *this,SSVectorBase<double> *vec)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  int __c;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  double dVar4;
  int i;
  int in_stack_ffffffffffffffcc;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  uint local_14;
  
  local_14 = size((SSVectorBase<double> *)0x2a0e22);
  while (local_14 = local_14 - 1, -1 < (int)local_14) {
    dVar4 = value(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = (SSVectorBase<double> *)&in_RDI->super_VectorBase<double>;
    pcVar2 = index(in_RSI,(char *)(ulong)local_14,__c);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffd0,
                        (long)(int)pcVar2);
    *pvVar3 = dVar4 + *pvVar3;
  }
  bVar1 = isSetup(in_RDI);
  if (bVar1) {
    in_RDI->setupStatus = false;
    setup(in_RDI);
  }
  return in_RDI;
}

Assistant:

SSVectorBase<R>& operator+=(const SSVectorBase<S>& vec)
   {
      assert(vec.isSetup());

      for(int i = vec.size() - 1; i >= 0; --i)
         VectorBase<R>::val[vec.index(i)] += vec.value(i);

      if(isSetup())
      {
         setupStatus = false;
         setup();
      }

      return *this;
   }